

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcRelAggregates::~IfcRelAggregates(IfcRelAggregates *this)

{
  ~IfcRelAggregates((IfcRelAggregates *)&this[-1].super_IfcRelDecomposes.field_0x28);
  return;
}

Assistant:

IfcRelAggregates() : Object("IfcRelAggregates") {}